

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall
Client::SendDataVector(Client *this,vector<DataElement,_std::allocator<DataElement>_> *V,int size)

{
  int __fd;
  ssize_t sVar1;
  reference __buf;
  int local_20;
  int local_1c;
  int i;
  int size_local;
  vector<DataElement,_std::allocator<DataElement>_> *V_local;
  Client *this_local;
  
  local_1c = size;
  _i = V;
  V_local = (vector<DataElement,_std::allocator<DataElement>_> *)this;
  sVar1 = send(this->sockfd,&local_1c,4,0);
  this->n = (int)sVar1;
  if (this->n < 0) {
    printf("ERROR writing to socket in client!\n");
  }
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    __fd = this->sockfd;
    __buf = std::vector<DataElement,_std::allocator<DataElement>_>::operator[](V,(long)local_20);
    sVar1 = send(__fd,__buf,0x10,0);
    this->n = (int)sVar1;
    if (this->n < 0) {
      printf("ERROR writing to socket in client!\n");
    }
  }
  return;
}

Assistant:

void Client::SendDataVector(std::vector<DataElement> V, int size)
{
    n = send(sockfd, &size, sizeof(size), 0);
    if (n < 0)
        printf("ERROR writing to socket in client!\n");
   
    for (int i = 0; i < size; i++)
    {
        n = send(sockfd, &V[i], sizeof(V[i]), 0);
        if (n < 0)
            printf("ERROR writing to socket in client!\n");
    }
}